

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_swab.c
# Opt level: O1

void TIFFSwabDouble(double *dp)

{
  ushort *puVar1;
  undefined1 uVar2;
  ushort uVar3;
  
  uVar2 = *(undefined1 *)((long)dp + 7);
  *(undefined1 *)((long)dp + 7) = *(undefined1 *)dp;
  *(undefined1 *)dp = uVar2;
  uVar3 = *(ushort *)((long)dp + 1);
  *(ushort *)((long)dp + 1) = *(ushort *)((long)dp + 5) << 8 | *(ushort *)((long)dp + 5) >> 8;
  *(ushort *)((long)dp + 5) = uVar3 << 8 | uVar3 >> 8;
  puVar1 = (ushort *)((long)dp + 3);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  return;
}

Assistant:

void TIFFSwabDouble(double *dp)
{
    register unsigned char *cp = (unsigned char *)dp;
    unsigned char t;
    assert(sizeof(double) == 8);
    t = cp[7];
    cp[7] = cp[0];
    cp[0] = t;
    t = cp[6];
    cp[6] = cp[1];
    cp[1] = t;
    t = cp[5];
    cp[5] = cp[2];
    cp[2] = t;
    t = cp[4];
    cp[4] = cp[3];
    cp[3] = t;
}